

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O1

void __thiscall
wasm::Pusher::Pusher
          (Pusher *this,Block *block,LocalAnalyzer *analyzer,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *numGetsSoFar,PassOptions *passOptions
          ,Module *module)

{
  Id IVar1;
  uint uVar2;
  Break *br;
  ExpressionList *pEVar3;
  Expression *pEVar4;
  LocalSet *pLVar5;
  Index firstPushable;
  Index IVar6;
  Index pushPoint;
  ulong uVar7;
  
  pEVar3 = &block->list;
  this->list = pEVar3;
  this->analyzer = analyzer;
  this->numGetsSoFar = numGetsSoFar;
  this->passOptions = passOptions;
  this->module = module;
  (this->pushableEffects)._M_h._M_buckets = &(this->pushableEffects)._M_h._M_single_bucket;
  (this->pushableEffects)._M_h._M_bucket_count = 1;
  (this->pushableEffects)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pushableEffects)._M_h._M_element_count = 0;
  (this->pushableEffects)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pushableEffects)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pushableEffects)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if ((block->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != 0) {
    firstPushable = 0xffffffff;
    uVar7 = 0;
    do {
      while (pushPoint = (Index)uVar7, firstPushable != 0xffffffff) {
        if ((this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
            .usedElements <= uVar7) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        pEVar4 = (this->list->
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
                 [uVar7];
        if (pEVar4->_id == DropId) {
          pEVar4 = *(Expression **)(pEVar4 + 1);
        }
        IVar1 = pEVar4->_id;
        if (IVar1 == BreakId) {
          if (pEVar4[2].type.id != 0) goto LAB_007fabe5;
        }
        else if ((IVar1 == IfId) || (IVar1 == BrOnId)) {
LAB_007fabe5:
          optimizeIntoIf(this,firstPushable,pushPoint);
          IVar6 = 0xffffffff;
          if (uVar7 < (this->list->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                      usedElements - 1) {
            uVar2 = optimizeSegment(this,firstPushable,pushPoint);
            uVar7 = 0xffffffff;
            goto LAB_007fac16;
          }
          goto LAB_007fac19;
        }
LAB_007fabd4:
        uVar7 = (ulong)(pushPoint + 1);
        pEVar3 = this->list;
        if ((pEVar3->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
            usedElements <= uVar7) {
          return;
        }
      }
      pLVar5 = isPushable(this,(pEVar3->
                               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ).data[uVar7]);
      if (pLVar5 == (LocalSet *)0x0) goto LAB_007fabd4;
      uVar2 = pushPoint + 1;
LAB_007fac16:
      IVar6 = (Index)uVar7;
      uVar7 = (ulong)uVar2;
LAB_007fac19:
      firstPushable = IVar6;
      pEVar3 = this->list;
    } while (uVar7 < (pEVar3->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     usedElements);
  }
  return;
}

Assistant:

Pusher(Block* block,
         LocalAnalyzer& analyzer,
         std::vector<Index>& numGetsSoFar,
         PassOptions& passOptions,
         Module& module)
    : list(block->list), analyzer(analyzer), numGetsSoFar(numGetsSoFar),
      passOptions(passOptions), module(module) {
    // Find an optimization segment: from the first pushable thing, to the first
    // point past which we want to push. We then push in that range before
    // continuing forward.
    const Index nothing = -1;
    Index i = 0;
    Index firstPushable = nothing;
    while (i < list.size()) {
      if (firstPushable == nothing && isPushable(list[i])) {
        firstPushable = i;
        i++;
        continue;
      }
      if (firstPushable != nothing && isPushPoint(list[i])) {
        // Optimize this segment, and proceed from where it tells us. First
        // optimize things into the if, if possible, which does not move the
        // push point. Then move things past the push point (which has the
        // relative effect of moving the push point backwards as other things
        // move forward).
        optimizeIntoIf(firstPushable, i);
        // We never need to push past a final element, as we couldn't be used
        // after it.
        if (i < list.size() - 1) {
          i = optimizeSegment(firstPushable, i);
        }
        firstPushable = nothing;
        continue;
      }
      i++;
    }
  }